

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O1

int __thiscall PosixSerialPort::get(PosixSerialPort *this)

{
  int iVar1;
  uint uVar2;
  uint8_t byte;
  byte local_9;
  
  uVar2 = 0xffffffff;
  if (this->_devfd != -1) {
    iVar1 = (*(this->super_SerialPort)._vptr_SerialPort[5])(this,&local_9,1);
    if (iVar1 == 1) {
      uVar2 = (uint)local_9;
    }
  }
  return uVar2;
}

Assistant:

int
PosixSerialPort::get()
{
    uint8_t byte;

    if (_devfd == -1)
        return -1;

    if (read(&byte, 1) != 1)
        return -1;

    return byte;
}